

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O0

uint32_t helper_atomic_xchgl_le_mmu_riscv32
                   (CPUArchState_conflict23 *env,target_ulong_conflict addr,uint32_t val,
                   TCGMemOpIdx oi,uintptr_t retaddr)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  uint32_t ret;
  uint32_t *haddr;
  uintptr_t retaddr_local;
  TCGMemOpIdx oi_local;
  uint32_t val_local;
  target_ulong_conflict addr_local;
  CPUArchState_conflict23 *env_local;
  
  puVar2 = (uint32_t *)atomic_mmu_lookup(env,addr,oi,retaddr);
  uVar1 = *puVar2;
  *puVar2 = val;
  return uVar1;
}

Assistant:

ABI_TYPE ATOMIC_NAME(xchg)(CPUArchState *env, target_ulong addr,
                           ABI_TYPE val EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;
    DATA_TYPE ret;

    ret = *haddr;
    *haddr = val;
    ATOMIC_MMU_CLEANUP;

    return ret;
}